

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O1

int archive_write_pax_header_xattrs(archive_write *a,pax *pax,archive_entry *entry)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  ulong uVar4;
  char *pcVar5;
  archive_string *as;
  size_t value_len;
  char *value_00;
  wchar_t wVar6;
  wchar_t wVar7;
  byte *pbVar8;
  byte *__s;
  size_t sVar9;
  int *piVar10;
  char *__s_00;
  char *pcVar11;
  byte bVar12;
  int iVar13;
  int iVar14;
  byte *pbVar15;
  pax *ppVar16;
  bool bVar17;
  size_t size;
  void *value;
  char *name;
  char *local_a0;
  archive_string local_88;
  archive_string *local_70;
  pax *local_68;
  archive_write *local_60;
  archive_string *local_58;
  archive_entry *local_50;
  size_t local_48;
  char *local_40;
  byte *local_38;
  
  local_50 = entry;
  wVar6 = archive_entry_xattr_reset(entry);
  if (wVar6 != L'\0') {
    local_58 = &pax->l_url_encoded_name;
    local_70 = &pax->pax_header;
    local_68 = pax;
    local_60 = a;
    do {
      archive_entry_xattr_next(local_50,(char **)&local_38,&local_40,&local_48);
      pbVar15 = local_38;
      bVar1 = *local_38;
      if (bVar1 == 0) {
        sVar9 = 1;
      }
      else {
        iVar14 = 0;
        bVar12 = bVar1;
        pbVar8 = local_38;
        do {
          pbVar8 = pbVar8 + 1;
          bVar17 = (byte)(bVar12 + 0x81) < 0xa2;
          iVar13 = bVar17 + 1 + (uint)bVar17;
          if (bVar12 == 0x25) {
            iVar13 = 3;
          }
          if (bVar12 == 0x3d) {
            iVar13 = 3;
          }
          iVar14 = iVar14 + iVar13;
          bVar12 = *pbVar8;
        } while (bVar12 != 0);
        sVar9 = (size_t)(iVar14 + 1);
      }
      __s = (byte *)malloc(sVar9);
      as = local_58;
      ppVar16 = local_68;
      pbVar8 = __s;
      if (__s == (byte *)0x0) {
        __s = (byte *)0x0;
      }
      else {
        while (bVar1 != 0) {
          pbVar15 = pbVar15 + 1;
          if (((((char)bVar1 < '!') || (bVar1 == 0x25)) || (bVar1 == 0x7f)) || (bVar1 == 0x3d)) {
            *pbVar8 = 0x25;
            pbVar8[1] = "0123456789ABCDEF"[bVar1 >> 4];
            pbVar8[2] = "0123456789ABCDEF"[bVar1 & 0xf];
            pbVar8 = pbVar8 + 3;
          }
          else {
            *pbVar8 = bVar1;
            pbVar8 = pbVar8 + 1;
          }
          bVar1 = *pbVar15;
        }
        *pbVar8 = 0;
      }
      if (__s == (byte *)0x0) {
        local_a0 = (char *)0x0;
      }
      else {
        sVar9 = strlen((char *)__s);
        wVar7 = archive_strncpy_l(as,__s,sVar9,ppVar16->sconv_utf8);
        free(__s);
        if (wVar7 == L'\0') {
          local_a0 = as->s;
        }
        else {
          piVar10 = __errno_location();
          if (*piVar10 == 0xc) {
            archive_set_error(&local_60->archive,0xc,"Can\'t allocate memory for Linkname");
            return -0x1e;
          }
          local_a0 = (char *)0x0;
        }
      }
      value_00 = local_40;
      value_len = local_48;
      if ((ppVar16->flags & 2) != 0) {
        __s_00 = (char *)malloc((local_48 * 4 + 2) / 3 + 1);
        pcVar11 = __s_00;
        uVar4 = value_len;
        pcVar5 = value_00;
        if (__s_00 == (char *)0x0) {
          __s_00 = (char *)0x0;
        }
        else {
          for (; 2 < uVar4; uVar4 = uVar4 - 3) {
            cVar2 = *pcVar5;
            cVar3 = pcVar5[1];
            bVar1 = pcVar5[2];
            *pcVar11 = base64_encode_digits[(uint)(int)cVar2 >> 2 & 0x3f];
            pcVar11[1] = base64_encode_digits
                         [(((int)cVar3 & 0xf0U) << 8 | ((int)cVar2 & 3U) << 0x10) >> 0xc];
            pcVar11[2] = base64_encode_digits[(uint)(int)CONCAT11(cVar3,bVar1) >> 6 & 0x3f];
            pcVar11[3] = base64_encode_digits[bVar1 & 0x3f];
            pcVar11 = pcVar11 + 4;
            pcVar5 = pcVar5 + 3;
          }
          if (uVar4 == 2) {
            cVar2 = *pcVar5;
            cVar3 = pcVar5[1];
            *pcVar11 = base64_encode_digits[(uint)(int)cVar2 >> 2 & 0x3f];
            pcVar11[1] = base64_encode_digits
                         [(((int)cVar3 & 0xf0U) << 8 | ((int)cVar2 & 3U) << 0x10) >> 0xc];
            pcVar11[2] = base64_encode_digits[(ulong)((int)cVar3 & 0xf) * 4];
            pcVar11 = pcVar11 + 3;
          }
          else if (uVar4 == 1) {
            cVar2 = *pcVar5;
            *pcVar11 = base64_encode_digits[(uint)(int)cVar2 >> 2 & 0x3f];
            pcVar11[1] = base64_encode_digits[((int)cVar2 & 3U) << 4];
            pcVar11 = pcVar11 + 2;
          }
          *pcVar11 = '\0';
        }
        if ((local_a0 != (char *)0x0) && (__s_00 != (char *)0x0)) {
          local_88.s = (char *)0x0;
          local_88.length = 0;
          local_88.buffer_length = 0;
          archive_strncat(&local_88,"LIBARCHIVE.xattr.",0x11);
          archive_strcat(&local_88,local_a0);
          pcVar11 = local_88.s;
          sVar9 = strlen(__s_00);
          ppVar16 = local_68;
          add_pax_attr_binary(local_70,pcVar11,__s_00,sVar9);
          archive_string_free(&local_88);
        }
        free(__s_00);
      }
      if ((ppVar16->flags & 1) != 0) {
        local_88.s = (char *)0x0;
        local_88.length = 0;
        local_88.buffer_length = 0;
        archive_strncat(&local_88,"SCHILY.xattr.",0xd);
        archive_strcat(&local_88,local_a0);
        add_pax_attr_binary(local_70,local_88.s,value_00,value_len);
        archive_string_free(&local_88);
      }
      wVar6 = wVar6 + L'\xffffffff';
    } while (wVar6 != L'\0');
  }
  return 0;
}

Assistant:

static int
archive_write_pax_header_xattrs(struct archive_write *a,
    struct pax *pax, struct archive_entry *entry)
{
	int i = archive_entry_xattr_reset(entry);

	while (i--) {
		const char *name;
		const void *value;
		char *url_encoded_name = NULL, *encoded_name = NULL;
		size_t size;
		int r;

		archive_entry_xattr_next(entry, &name, &value, &size);
		url_encoded_name = url_encode(name);
		if (url_encoded_name != NULL) {
			/* Convert narrow-character to UTF-8. */
			r = archive_strcpy_l(&(pax->l_url_encoded_name),
			    url_encoded_name, pax->sconv_utf8);
			free(url_encoded_name); /* Done with this. */
			if (r == 0)
				encoded_name = pax->l_url_encoded_name.s;
			else if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Linkname");
				return (ARCHIVE_FATAL);
			}
		}

		archive_write_pax_header_xattr(pax, encoded_name,
		    value, size);

	}
	return (ARCHIVE_OK);
}